

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O2

unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> __thiscall
bssl::CreateCertErrorParams1SizeT(bssl *this,char *name,size_t value)

{
  undefined8 *puVar1;
  
  if (name != (char *)0x0) {
    puVar1 = (undefined8 *)operator_new(0x18);
    *puVar1 = &PTR__CertErrorParams_005c0778;
    puVar1[1] = name;
    puVar1[2] = value;
    *(undefined8 **)this = puVar1;
    return (__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
            )(__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
              )this;
  }
  abort();
}

Assistant:

std::unique_ptr<CertErrorParams> CreateCertErrorParams1SizeT(const char *name,
                                                             size_t value) {
  BSSL_CHECK(name);
  return std::make_unique<CertErrorParams1SizeT>(name, value);
}